

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::detail::WriteFloat<double>(ostringstream *str,double *arg,char mod)

{
  undefined8 *puVar1;
  int iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = (int)CONCAT71(in_register_00000011,mod);
  if (iVar2 == 0x6c) {
    std::ostream::_M_insert<double>(*arg);
    return;
  }
  if (iVar2 == 0x3f) {
    std::ostream::_M_insert<double>(*arg);
    return;
  }
  if (iVar2 == 0x4c) {
    std::ostream::_M_insert<long_double>((longdouble)*arg);
    return;
  }
  if (iVar2 == 0) {
    Write_impl<double,_double,_true>::f((ostream *)str,arg);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = std::__cxx11::string::pop_back;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void WriteFloat(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 0:
	case 'l': Write<double>(str, arg); break;
	case 'L': Write<long double>(str, arg); break;
	case '?': WriteAnyFloat(str, arg); break;
	default: throw std::exception(); break;
	}
}